

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_MakePI(int NP,char *str)

{
  int iVar1;
  
  iVar1 = 0x61;
  while( true ) {
    if (iVar1 == 0x66) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0x30a,"void Dtt_MakePI(int, char *)");
    }
    if ((NP & 7U) == 0) break;
    NP = NP >> 4;
    iVar1 = iVar1 + 1;
  }
  if ((NP & 8U) == 0) {
    *str = (char)iVar1;
    str[1] = '\0';
    return;
  }
  sprintf(str,"~%c");
  return;
}

Assistant:

void Dtt_MakePI( int NP, char* str )
{
    // apply P'[i], find the i s.t. P'[i]==0, correspond to N'[i]
    int i;
    for ( i = 0; i < 5; i++ )
    {
        if ( ( NP & 0x7 ) == 0 )
        {
            if ( NP & 0x8 ) 
                sprintf( str, "~%c", 'a'+i );
            else
                sprintf( str, "%c", 'a'+i );
            return;
        }
        NP = NP >> 4;
    }
    assert(0);
}